

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyi_generator.cc
# Opt level: O0

bool __thiscall google::protobuf::compiler::python::IsWellKnownType(python *this,string_view name)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  bool bVar1;
  bool local_d9;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_d8;
  python *local_c8;
  char *local_c0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_b8;
  python *local_a8;
  char *local_a0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_98;
  python *local_88;
  char *local_80;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_78;
  python *local_68;
  char *local_60;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_58;
  python *local_48;
  char *local_40;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_38;
  python *local_28;
  char *local_20;
  python *local_18;
  string_view name_local;
  
  local_20 = (char *)name._M_len;
  local_28 = this;
  local_18 = this;
  name_local._M_len = (size_t)local_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_38,"google.protobuf.Any");
  __x_04._M_str = local_20;
  __x_04._M_len = (size_t)local_28;
  bVar1 = std::operator==(__x_04,local_38);
  local_d9 = true;
  if (!bVar1) {
    local_48 = local_18;
    local_40 = (char *)name_local._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_58,"google.protobuf.Duration");
    __x_03._M_str = local_40;
    __x_03._M_len = (size_t)local_48;
    bVar1 = std::operator==(__x_03,local_58);
    local_d9 = true;
    if (!bVar1) {
      local_68 = local_18;
      local_60 = (char *)name_local._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_78,"google.protobuf.FieldMask");
      __x_02._M_str = local_60;
      __x_02._M_len = (size_t)local_68;
      bVar1 = std::operator==(__x_02,local_78);
      local_d9 = true;
      if (!bVar1) {
        local_88 = local_18;
        local_80 = (char *)name_local._M_len;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_98,"google.protobuf.ListValue");
        __x_01._M_str = local_80;
        __x_01._M_len = (size_t)local_88;
        bVar1 = std::operator==(__x_01,local_98);
        local_d9 = true;
        if (!bVar1) {
          local_a8 = local_18;
          local_a0 = (char *)name_local._M_len;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_b8,"google.protobuf.Struct");
          __x_00._M_str = local_a0;
          __x_00._M_len = (size_t)local_a8;
          bVar1 = std::operator==(__x_00,local_b8);
          local_d9 = true;
          if (!bVar1) {
            local_c8 = local_18;
            local_c0 = (char *)name_local._M_len;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_d8,"google.protobuf.Timestamp");
            __x._M_str = local_c0;
            __x._M_len = (size_t)local_c8;
            local_d9 = std::operator==(__x,local_d8);
          }
        }
      }
    }
  }
  return local_d9;
}

Assistant:

bool IsWellKnownType(const absl::string_view name) {
  // LINT.IfChange(wktbases)
  return (name == "google.protobuf.Any" ||
          name == "google.protobuf.Duration" ||
          name == "google.protobuf.FieldMask" ||
          name == "google.protobuf.ListValue" ||
          name == "google.protobuf.Struct" ||
          name == "google.protobuf.Timestamp");
  // LINT.ThenChange(//depot/google3/net/proto2/python/internal/well_known_types.py:wktbases)
}